

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromBundle(CollationLoader *this,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  UResourceBundle *pUVar3;
  UChar *us;
  UChar *s;
  int32_t length;
  LocalUResourceBundlePointer def;
  UErrorCode internalErrorCode;
  UErrorCode *errorCode_local;
  CollationLoader *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    pUVar3 = ures_getByKey_63(this->bundle,"collations",(UResourceBundle *)0x0,errorCode);
    this->collations = pUVar3;
    if (*errorCode == U_MISSING_RESOURCE_ERROR) {
      *errorCode = U_USING_DEFAULT_WARNING;
      this_local = (CollationLoader *)makeCacheEntryFromRoot(this,&this->validLocale,errorCode);
    }
    else {
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 == '\0') {
        def.super_LocalPointerBase<UResourceBundle>.ptr._4_4_ = U_ZERO_ERROR;
        pUVar3 = ures_getByKeyWithFallback_63
                           (this->collations,"default",(UResourceBundle *)0x0,
                            (UErrorCode *)
                            ((long)&def.super_LocalPointerBase<UResourceBundle>.ptr + 4));
        LocalUResourceBundlePointer::LocalUResourceBundlePointer
                  ((LocalUResourceBundlePointer *)&stack0xffffffffffffffd0,pUVar3);
        pUVar3 = LocalPointerBase<UResourceBundle>::getAlias
                           ((LocalPointerBase<UResourceBundle> *)&stack0xffffffffffffffd0);
        us = ures_getString_63(pUVar3,(int32_t *)((long)&s + 4),
                               (UErrorCode *)
                               ((long)&def.super_LocalPointerBase<UResourceBundle>.ptr + 4));
        UVar1 = ::U_SUCCESS(def.super_LocalPointerBase<UResourceBundle>.ptr._4_4_);
        if (((UVar1 == '\0') || (s._4_4_ < 1)) || (0xf < s._4_4_)) {
          strcpy(this->defaultType,"standard");
        }
        else {
          u_UCharsToChars_63(us,this->defaultType,s._4_4_ + 1);
        }
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                  ((LocalUResourceBundlePointer *)&stack0xffffffffffffffd0);
        if (this->type[0] == '\0') {
          strcpy(this->type,this->defaultType);
          this->typesTried = this->typesTried | 2;
          iVar2 = strcmp(this->type,"search");
          if (iVar2 == 0) {
            this->typesTried = this->typesTried | 1;
          }
          iVar2 = strcmp(this->type,"standard");
          if (iVar2 == 0) {
            this->typesTried = this->typesTried | 4;
          }
          Locale::setKeywordValue(&this->locale,"collation",this->type,errorCode);
          this_local = (CollationLoader *)getCacheEntry(this,errorCode);
        }
        else {
          iVar2 = strcmp(this->type,this->defaultType);
          if (iVar2 == 0) {
            this->typesTried = this->typesTried | 2;
          }
          iVar2 = strcmp(this->type,"search");
          if (iVar2 == 0) {
            this->typesTried = this->typesTried | 1;
          }
          iVar2 = strcmp(this->type,"standard");
          if (iVar2 == 0) {
            this->typesTried = this->typesTried | 4;
          }
          this_local = (CollationLoader *)loadFromCollations(this,errorCode);
        }
      }
      else {
        this_local = (CollationLoader *)0x0;
      }
    }
  }
  else {
    this_local = (CollationLoader *)0x0;
  }
  return (CollationCacheEntry *)this_local;
}

Assistant:

const CollationCacheEntry *
CollationLoader::loadFromBundle(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return NULL; }
    U_ASSERT(collations == NULL);
    // There are zero or more tailorings in the collations table.
    collations = ures_getByKey(bundle, "collations", NULL, &errorCode);
    if(errorCode == U_MISSING_RESOURCE_ERROR) {
        errorCode = U_USING_DEFAULT_WARNING;
        // Return the root tailoring with the validLocale, without collation type.
        return makeCacheEntryFromRoot(validLocale, errorCode);
    }
    if(U_FAILURE(errorCode)) { return NULL; }

    // Fetch the default type from the data.
    {
        UErrorCode internalErrorCode = U_ZERO_ERROR;
        LocalUResourceBundlePointer def(
                ures_getByKeyWithFallback(collations, "default", NULL, &internalErrorCode));
        int32_t length;
        const UChar *s = ures_getString(def.getAlias(), &length, &internalErrorCode);
        if(U_SUCCESS(internalErrorCode) && 0 < length && length < UPRV_LENGTHOF(defaultType)) {
            u_UCharsToChars(s, defaultType, length + 1);
        } else {
            uprv_strcpy(defaultType, "standard");
        }
    }

    // Record which collation types we have looked for already,
    // so that we do not deadlock in the cache.
    //
    // If there is no explicit type, then we look in the cache
    // for the entry with the default type.
    // If the explicit type is the default type, then we do not look in the cache
    // for the entry with an empty type.
    // Otherwise, two concurrent requests with opposite fallbacks would deadlock each other.
    // Also, it is easier to always enter the next method with a non-empty type.
    if(type[0] == 0) {
        uprv_strcpy(type, defaultType);
        typesTried |= TRIED_DEFAULT;
        if(uprv_strcmp(type, "search") == 0) {
            typesTried |= TRIED_SEARCH;
        }
        if(uprv_strcmp(type, "standard") == 0) {
            typesTried |= TRIED_STANDARD;
        }
        locale.setKeywordValue("collation", type, errorCode);
        return getCacheEntry(errorCode);
    } else {
        if(uprv_strcmp(type, defaultType) == 0) {
            typesTried |= TRIED_DEFAULT;
        }
        if(uprv_strcmp(type, "search") == 0) {
            typesTried |= TRIED_SEARCH;
        }
        if(uprv_strcmp(type, "standard") == 0) {
            typesTried |= TRIED_STANDARD;
        }
        return loadFromCollations(errorCode);
    }
}